

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

bool cmFileAPI::ReadRequestVersion
               (Value *version,bool inArray,
               vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *result
               ,string *error)

{
  bool bVar1;
  Value *pVVar2;
  value_type local_30;
  
  bVar1 = Json::Value::isUInt(version);
  if (bVar1) {
    local_30.Minor = 0;
    local_30.Major = Json::Value::asUInt(version);
    goto LAB_0025c8bf;
  }
  bVar1 = Json::Value::isObject(version);
  if (bVar1) {
    pVVar2 = Json::Value::operator[](version,"major");
    bVar1 = Json::Value::isNull(pVVar2);
    if ((!bVar1) && (bVar1 = Json::Value::isUInt(pVVar2), bVar1)) {
      local_30.Minor = 0;
      local_30.Major = Json::Value::asUInt(pVVar2);
      pVVar2 = Json::Value::operator[](version,"minor");
      bVar1 = Json::Value::isUInt(pVVar2);
      if (bVar1) {
        local_30.Minor = Json::Value::asUInt(pVVar2);
      }
      else {
        bVar1 = Json::Value::isNull(pVVar2);
        if (!bVar1) goto LAB_0025c965;
      }
LAB_0025c8bf:
      std::vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>::push_back
                (result,&local_30);
      return true;
    }
  }
LAB_0025c965:
  std::__cxx11::string::assign((char *)error);
  return false;
}

Assistant:

bool cmFileAPI::ReadRequestVersion(Json::Value const& version, bool inArray,
                                   std::vector<RequestVersion>& result,
                                   std::string& error)
{
  if (version.isUInt()) {
    RequestVersion v;
    v.Major = version.asUInt();
    result.push_back(v);
    return true;
  }

  if (!version.isObject()) {
    if (inArray) {
      error = "'version' array entry is not a non-negative integer or object";
    } else {
      error =
        "'version' member is not a non-negative integer, object, or array";
    }
    return false;
  }

  Json::Value const& major = version["major"];
  if (major.isNull()) {
    error = "'version' object 'major' member missing";
    return false;
  }
  if (!major.isUInt()) {
    error = "'version' object 'major' member is not a non-negative integer";
    return false;
  }

  RequestVersion v;
  v.Major = major.asUInt();

  Json::Value const& minor = version["minor"];
  if (minor.isUInt()) {
    v.Minor = minor.asUInt();
  } else if (!minor.isNull()) {
    error = "'version' object 'minor' member is not a non-negative integer";
    return false;
  }

  result.push_back(v);

  return true;
}